

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

ostream * smf::MidiFile::writeBigEndianDouble(ostream *out,double value)

{
  undefined8 in_RAX;
  char local_18;
  char local_17;
  undefined1 local_16;
  char local_15;
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  _local_16 = (undefined6)((ulong)in_RAX >> 0x10);
  _local_18 = CONCAT11((char)((ulong)value >> 0x38),(char)in_RAX);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_17,1);
  _local_18 = CONCAT12((char)((ulong)value >> 0x30),_local_18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_16,1);
  _local_18 = CONCAT13((char)((ulong)value >> 0x28),_local_18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_15,1);
  _local_18 = CONCAT14((char)((ulong)value >> 0x20),_local_18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_14,1);
  _local_18 = CONCAT15((char)((ulong)value >> 0x18),_local_18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_13,1);
  _local_18 = CONCAT16((char)((ulong)value >> 0x10),_local_18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_12,1);
  _local_18 = CONCAT71(_local_17,(char)((ulong)value >> 8));
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_18,1);
  _local_18 = CONCAT17(SUB81(value,0),_local_18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_11,1);
  return out;
}

Assistant:

std::ostream& MidiFile::writeBigEndianDouble(std::ostream& out, double value) {
	union { char bytes[8]; double d; } data;
	data.d = value;
	out << data.bytes[7];
	out << data.bytes[6];
	out << data.bytes[5];
	out << data.bytes[4];
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;
}